

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O0

duration __thiscall
so_5::stats::impl::std_controller_t::set_distribution_period(std_controller_t *this,duration period)

{
  rep rVar1;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  std_controller_t *this_local;
  duration period_local;
  duration ret_value;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_data_lock);
  rVar1 = (this->m_distribution_period).__r;
  (this->m_distribution_period).__r = period.__r;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return (duration)rVar1;
}

Assistant:

std::chrono::steady_clock::duration
std_controller_t::set_distribution_period(
	std::chrono::steady_clock::duration period )
	{
		std::lock_guard< std::mutex > lock{ m_data_lock };
		
		auto ret_value = m_distribution_period;

		m_distribution_period = period;

		return ret_value;
	}